

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_bool duckdb_miniz::mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  mz_zip_internal_state *pmVar1;
  int *__src;
  mz_bool mVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  int *piVar8;
  uint in_EDX;
  long in_RSI;
  mz_zip_archive *in_RDI;
  bool bVar9;
  mz_zip_array new_ext_block;
  mz_uint8 *pSrc_ext;
  mz_uint64 src_uncomp_size;
  mz_uint64 src_comp_size;
  mz_uint32 src_crc32;
  mz_uint32 *pSrc_descriptor;
  mz_bool has_id;
  mz_uint64 approx_new_archive_size;
  mz_uint8 *pSrc_field_data;
  mz_uint32 field_total_size;
  mz_uint32 field_data_size;
  mz_uint32 field_id;
  mz_uint32 extra_size_remaining;
  mz_uint8 *pExtra_data;
  mz_zip_array file_data_array;
  mz_bool found_zip64_ext_data_in_ldir;
  mz_uint64 local_header_uncomp_size;
  mz_uint64 local_header_comp_size;
  mz_uint32 local_header_extra_len;
  mz_uint32 local_header_filename_size;
  mz_uint32 src_ext_len;
  mz_uint32 src_comment_len;
  mz_uint32 src_filename_len;
  mz_zip_archive_file_stat src_file_stat;
  mz_uint8 *pSrc_central_header;
  void *pBuf;
  mz_zip_internal_state *pState;
  size_t orig_central_dir_size;
  mz_uint8 new_central_header [46];
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  mz_uint64 cur_dst_file_ofs;
  mz_uint64 cur_src_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint64 src_archive_bytes_remaining;
  mz_uint src_central_dir_following_data_size;
  mz_uint num_alignment_padding_bytes;
  mz_uint bit_flags;
  mz_uint n;
  size_t orig_size_6;
  size_t orig_size_5;
  size_t orig_size_4;
  size_t orig_size_3;
  size_t orig_size_2;
  size_t orig_size_1;
  size_t orig_size;
  mz_zip_archive *in_stack_fffffffffffff300;
  mz_uint growing;
  mz_zip_archive *in_stack_fffffffffffff308;
  mz_zip_array *in_stack_fffffffffffff310;
  mz_zip_archive *pArray;
  mz_zip_archive *in_stack_fffffffffffff318;
  mz_zip_archive *pZip_00;
  void *local_cd0;
  long local_cc8;
  mz_bool *in_stack_fffffffffffff340;
  mz_zip_archive_file_stat *in_stack_fffffffffffff348;
  mz_uint8 *in_stack_fffffffffffff350;
  mz_uint64 *in_stack_fffffffffffff358;
  mz_zip_archive *in_stack_fffffffffffff360;
  uint32_t in_stack_fffffffffffff36c;
  uint32_t *in_stack_fffffffffffff370;
  undefined4 in_stack_fffffffffffff378;
  uint in_stack_fffffffffffff37c;
  mz_zip_array *in_stack_fffffffffffff380;
  uint local_c64;
  short *local_c60;
  short *local_c58 [2];
  short *local_c48;
  int local_c34;
  ulong local_c30;
  ulong local_c28;
  uint local_c1c;
  uint local_c18;
  uint local_c14;
  uint local_c10;
  uint local_c0c;
  long local_be8;
  long local_bd0;
  mz_uint64 *in_stack_fffffffffffff590;
  mz_uint32 *in_stack_fffffffffffff598;
  undefined1 local_798 [20];
  undefined1 local_784;
  undefined1 local_783;
  undefined1 local_782;
  undefined1 local_781;
  undefined1 local_780;
  undefined1 local_77f;
  undefined1 local_77e;
  undefined1 local_77d;
  undefined1 local_77a;
  undefined1 local_779;
  undefined1 local_76e;
  undefined1 local_76d;
  undefined1 local_76c;
  undefined1 local_76b;
  int *local_760;
  int local_758 [8];
  mz_uint64 local_738;
  long local_730;
  mz_uint64 local_728;
  mz_zip_archive *local_720;
  uint local_714;
  mz_uint local_710;
  uint local_70c;
  uint local_708 [2];
  long local_700;
  mz_zip_archive *local_6f8;
  mz_bool local_6f0;
  int *local_4e0;
  uint local_4d4;
  undefined8 local_4d0;
  long local_4c0;
  undefined4 local_4b4;
  void **local_4b0;
  undefined4 local_4a4;
  short **local_4a0;
  undefined4 local_494;
  ulong local_490;
  mz_zip_internal_state *local_488;
  mz_zip_archive *local_480;
  undefined4 local_474;
  ulong local_470;
  mz_zip_internal_state *local_468;
  mz_zip_archive *local_460;
  undefined4 local_454;
  ulong local_450;
  mz_zip_internal_state *local_448;
  mz_zip_archive *local_440;
  undefined4 local_434;
  ulong local_430;
  mz_zip_internal_state *local_428;
  mz_zip_archive *local_420;
  undefined4 local_414;
  ulong local_410;
  mz_zip_internal_state *local_408;
  mz_zip_archive *local_400;
  undefined4 local_3f4;
  ulong local_3f0;
  mz_zip_internal_state *local_3e8;
  mz_zip_archive *local_3e0;
  undefined4 local_3d4;
  short *local_3d0;
  short **local_3c8;
  mz_zip_archive *local_3c0;
  int local_3b4;
  void **local_3b0;
  mz_zip_archive *local_3a8;
  void **local_3a0;
  mz_zip_archive *local_398;
  void **local_390;
  mz_zip_archive *local_388;
  void **local_380;
  mz_zip_archive *local_378;
  void **local_370;
  mz_zip_archive *local_368;
  void **local_360;
  mz_zip_archive *local_358;
  short **local_350;
  mz_zip_archive *local_348;
  short **local_340;
  mz_zip_archive *local_338;
  short **local_330;
  mz_zip_archive *local_328;
  short **local_320;
  mz_zip_archive *local_318;
  short **local_310;
  mz_zip_archive *local_308;
  undefined4 local_2fc;
  undefined1 *local_2f8;
  undefined4 local_2ec;
  undefined1 *local_2e8;
  undefined4 local_2dc;
  undefined1 *local_2d8;
  undefined4 local_2cc;
  undefined1 *local_2c8;
  uint32_t local_2bc;
  int *local_2b8;
  undefined4 local_2ac;
  int *local_2a8;
  mz_uint64 *local_2a0;
  int *local_298;
  undefined4 local_28c;
  int *local_288;
  uint local_27c;
  int *local_278;
  mz_zip_archive *local_270;
  int *local_268;
  undefined4 local_25c;
  int *local_258;
  uint local_24c;
  int *local_248;
  undefined2 local_23a;
  undefined1 *local_238;
  size_t local_230;
  long local_228;
  uint *local_220;
  mz_zip_array *local_218;
  mz_zip_archive *local_210;
  uint local_208;
  undefined4 local_204;
  ulong local_200;
  mz_zip_array *local_1f8;
  mz_zip_archive *local_1f0;
  int local_1e4;
  size_t local_1e0;
  ulong local_1d8;
  void *local_1d0;
  mz_zip_internal_state *local_1c8;
  mz_zip_archive *local_1c0;
  uint local_1b8;
  undefined4 local_1b4;
  ulong local_1b0;
  mz_zip_internal_state *local_1a8;
  mz_zip_archive *local_1a0;
  int local_194;
  size_t local_190;
  long local_188;
  undefined1 *local_180;
  mz_zip_internal_state *local_178;
  mz_zip_archive *local_170;
  uint local_168;
  undefined4 local_164;
  ulong local_160;
  mz_zip_internal_state *local_158;
  mz_zip_archive *local_150;
  int local_144;
  size_t local_140;
  ulong local_138;
  void *local_130;
  mz_zip_internal_state *local_128;
  mz_zip_archive *local_120;
  uint local_118;
  undefined4 local_114;
  ulong local_110;
  mz_zip_internal_state *local_108;
  mz_zip_archive *local_100;
  int local_f4;
  size_t local_f0;
  long local_e8;
  void *local_e0;
  mz_zip_internal_state *local_d8;
  mz_zip_archive *local_d0;
  uint local_c8;
  undefined4 local_c4;
  ulong local_c0;
  mz_zip_internal_state *local_b8;
  mz_zip_archive *local_b0;
  int local_a4;
  size_t local_a0;
  ulong local_98;
  void *local_90;
  mz_zip_internal_state *local_88;
  mz_zip_archive *local_80;
  uint local_78;
  undefined4 local_74;
  ulong local_70;
  mz_zip_internal_state *local_68;
  mz_zip_archive *local_60;
  int local_54;
  size_t local_50;
  long local_48;
  undefined1 *local_40;
  mz_zip_internal_state *local_38;
  mz_zip_archive *local_30;
  uint local_28;
  undefined4 local_24;
  ulong local_20;
  mz_zip_internal_state *local_18;
  mz_zip_archive *local_10;
  int local_4;
  
  local_760 = local_758;
  local_c34 = 0;
  if ((((in_RDI == (mz_zip_archive *)0x0) || (in_RDI->m_pState == (mz_zip_internal_state *)0x0)) ||
      (in_RDI->m_zip_mode != MZ_ZIP_MODE_WRITING)) || (*(long *)(in_RSI + 0x48) == 0)) {
    if (in_RDI != (mz_zip_archive *)0x0) {
      in_RDI->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    local_6f0 = 0;
  }
  else {
    pmVar1 = in_RDI->m_pState;
    if ((*(int *)(*(long *)(in_RSI + 0x68) + 100) == 0) || (in_RDI->m_pState->m_zip64 != 0)) {
      if ((in_RSI == 0) || ((*(long *)(in_RSI + 0x68) == 0 || (*(uint *)(in_RSI + 0x10) <= in_EDX)))
         ) {
        local_4e0 = (int *)0x0;
      }
      else {
        local_4d0 = *(undefined8 *)(in_RSI + 0x68);
        local_4c0 = *(long *)(in_RSI + 0x68) + 0x20;
        local_4d4 = *(uint *)(*(long *)(*(long *)(in_RSI + 0x68) + 0x20) + (ulong)in_EDX * 4);
        local_4e0 = (int *)(**(long **)(in_RSI + 0x68) + (ulong)local_4d4);
      }
      __src = local_4e0;
      if (local_4e0 == (int *)0x0) {
        if (in_RDI != (mz_zip_archive *)0x0) {
          in_RDI->m_last_error = MZ_ZIP_INVALID_PARAMETER;
        }
        local_6f0 = 0;
      }
      else if (*local_4e0 == 0x2014b50) {
        local_c0c = (uint)*(ushort *)(local_4e0 + 7);
        local_c10 = (uint)*(ushort *)(local_4e0 + 8);
        local_c14 = (uint)*(ushort *)((long)local_4e0 + 0x1e);
        local_714 = local_c0c + local_c14 + local_c10;
        if ((pmVar1->m_central_dir).m_size + (ulong)local_714 + 0x4e < 0xffffffff) {
          local_700 = in_RSI;
          local_6f8 = in_RDI;
          local_710 = mz_zip_writer_compute_padding_needed_for_file_alignment(in_RDI);
          if (pmVar1->m_zip64 == 0) {
            if (local_6f8->m_total_files == 0xffff) {
              if (local_6f8 != (mz_zip_archive *)0x0) {
                local_6f8->m_last_error = MZ_ZIP_TOO_MANY_FILES;
              }
              return 0;
            }
          }
          else if (local_6f8->m_total_files == 0xffffffff) {
            if (local_6f8 != (mz_zip_archive *)0x0) {
              local_6f8->m_last_error = MZ_ZIP_TOO_MANY_FILES;
            }
            return 0;
          }
          mVar2 = mz_zip_file_stat_internal
                            (in_stack_fffffffffffff360,
                             (mz_uint)((ulong)in_stack_fffffffffffff358 >> 0x20),
                             in_stack_fffffffffffff350,in_stack_fffffffffffff348,
                             in_stack_fffffffffffff340);
          if (mVar2 == 0) {
            local_6f0 = 0;
          }
          else {
            local_730 = local_bd0;
            local_738 = local_6f8->m_archive_size;
            lVar5 = (**(code **)(local_700 + 0x48))
                              (*(undefined8 *)(local_700 + 0x60),local_bd0,local_760,0x1e);
            if (lVar5 == 0x1e) {
              if (*local_760 == 0x4034b50) {
                local_730 = local_730 + 0x1e;
                local_c18 = (uint)*(ushort *)((long)local_760 + 0x1a);
                local_c64 = (uint)*(ushort *)(local_760 + 7);
                local_c28 = (ulong)*(uint *)((long)local_760 + 0x12);
                local_c30 = (ulong)*(uint *)((long)local_760 + 0x16);
                local_720 = (mz_zip_archive *)((ulong)(local_c18 + local_c64) + local_be8);
                local_c1c = local_c64;
                if ((local_c64 != 0) && ((local_c28 == 0xffffffff || (local_c30 == 0xffffffff)))) {
                  local_4a0 = local_c58;
                  local_4a4 = 1;
                  memset(local_4a0,0,0x20);
                  *(undefined4 *)(local_4a0 + 3) = local_4a4;
                  local_3d0 = (short *)(ulong)local_c1c;
                  local_3c0 = local_6f8;
                  local_3c8 = local_c58;
                  local_3d4 = 0;
                  if ((local_c48 < local_3d0) &&
                     (mVar2 = mz_zip_array_ensure_capacity
                                        (in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                                         (size_t)in_stack_fffffffffffff308,
                                         (mz_uint)((ulong)in_stack_fffffffffffff300 >> 0x20)),
                     mVar2 == 0)) {
                    local_3b4 = 0;
                  }
                  else {
                    local_3c8[1] = local_3d0;
                    local_3b4 = 1;
                  }
                  if (local_3b4 == 0) {
                    if (local_6f8 != (mz_zip_archive *)0x0) {
                      local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    }
                    return 0;
                  }
                  uVar6 = (**(code **)(local_700 + 0x48))
                                    (*(undefined8 *)(local_700 + 0x60),
                                     local_bd0 + 0x1e + (ulong)local_c18,local_c58[0],local_c1c);
                  if (uVar6 != local_c1c) {
                    local_308 = local_6f8;
                    local_310 = local_c58;
                    (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_c58[0]);
                    memset(local_310,0,0x20);
                    if (local_6f8 != (mz_zip_archive *)0x0) {
                      local_6f8->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                    }
                    return 0;
                  }
                  local_c60 = local_c58[0];
                  do {
                    if (local_c64 < 4) {
                      local_318 = local_6f8;
                      local_320 = local_c58;
                      (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_c58[0]);
                      memset(local_320,0,0x20);
                      if (local_6f8 != (mz_zip_archive *)0x0) {
                        local_6f8->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                      }
                      return 0;
                    }
                    uVar3 = (ushort)local_c60[1] + 4;
                    if (local_c64 < uVar3) {
                      local_328 = local_6f8;
                      local_330 = local_c58;
                      (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_c58[0]);
                      memset(local_330,0,0x20);
                      if (local_6f8 != (mz_zip_archive *)0x0) {
                        local_6f8->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                      }
                      return 0;
                    }
                    if (*local_c60 == 1) {
                      if ((ushort)local_c60[1] < 0x10) {
                        local_338 = local_6f8;
                        local_340 = local_c58;
                        (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_c58[0]);
                        memset(local_340,0,0x20);
                        if (local_6f8 != (mz_zip_archive *)0x0) {
                          local_6f8->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                        }
                        return 0;
                      }
                      local_c30 = *(ulong *)(local_c60 + 2);
                      local_c28 = *(ulong *)(local_c60 + 6);
                      local_c34 = 1;
                      break;
                    }
                    local_c60 = (short *)((long)local_c60 + (ulong)uVar3);
                    local_c64 = local_c64 - uVar3;
                  } while (local_c64 != 0);
                  local_348 = local_6f8;
                  local_350 = local_c58;
                  (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_c58[0]);
                  memset(local_350,0,0x20);
                }
                if ((pmVar1->m_zip64 == 0) &&
                   (in_stack_fffffffffffff380 =
                         (mz_zip_array *)
                         ((long)&local_720[1].m_pAlloc_opaque +
                         (ulong)local_714 + (pmVar1->m_central_dir).m_size + local_738 + local_710 +
                         2), (mz_zip_array *)0xfffffffe < in_stack_fffffffffffff380)) {
                  if (local_6f8 != (mz_zip_archive *)0x0) {
                    local_6f8->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
                  }
                  local_6f0 = 0;
                }
                else {
                  mVar2 = mz_zip_writer_write_zeros
                                    ((mz_zip_archive *)src_file_stat.m_filename._432_8_,
                                     src_file_stat.m_filename._424_8_,
                                     src_file_stat.m_filename._420_4_);
                  if (mVar2 == 0) {
                    local_6f0 = 0;
                  }
                  else {
                    local_738 = local_710 + local_738;
                    local_728 = local_738;
                    sVar7 = (*local_6f8->m_pWrite)(local_6f8->m_pIO_opaque,local_738,local_760,0x1e)
                    ;
                    if (sVar7 == 0x1e) {
                      local_738 = local_738 + 0x1e;
                      pZip_00 = local_720;
                      if ((mz_zip_archive *)0x10000 < local_720) {
                        pZip_00 = (mz_zip_archive *)0x10000;
                      }
                      if (pZip_00 < (mz_zip_archive *)0x20) {
                        pArray = (mz_zip_archive *)0x20;
                      }
                      else {
                        in_stack_fffffffffffff308 = local_720;
                        pArray = local_720;
                        if ((mz_zip_archive *)0x10000 < local_720) {
                          in_stack_fffffffffffff308 = (mz_zip_archive *)0x10000;
                          pArray = in_stack_fffffffffffff308;
                        }
                      }
                      piVar8 = (int *)(*local_6f8->m_pAlloc)
                                                (local_6f8->m_pAlloc_opaque,1,(size_t)pArray);
                      if (piVar8 == (int *)0x0) {
                        if (local_6f8 != (mz_zip_archive *)0x0) {
                          local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                        }
                        local_6f0 = 0;
                      }
                      else {
                        for (; growing = (mz_uint)((ulong)in_stack_fffffffffffff300 >> 0x20),
                            local_720 != (mz_zip_archive *)0x0;
                            local_720 = (mz_zip_archive *)((long)local_720 - (ulong)local_708[0])) {
                          in_stack_fffffffffffff300 = local_720;
                          if ((mz_zip_archive *)0x10000 < local_720) {
                            in_stack_fffffffffffff300 = (mz_zip_archive *)0x10000;
                          }
                          local_708[0] = (uint)in_stack_fffffffffffff300;
                          uVar6 = (**(code **)(local_700 + 0x48))
                                            (*(undefined8 *)(local_700 + 0x60),local_730,piVar8,
                                             (ulong)in_stack_fffffffffffff300 & 0xffffffff);
                          if (uVar6 != local_708[0]) {
                            (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,piVar8);
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                            }
                            return 0;
                          }
                          local_730 = (ulong)local_708[0] + local_730;
                          sVar7 = (*local_6f8->m_pWrite)
                                            (local_6f8->m_pIO_opaque,local_738,piVar8,
                                             (ulong)local_708[0]);
                          if (sVar7 != local_708[0]) {
                            (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,piVar8);
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                            }
                            return 0;
                          }
                          local_738 = local_708[0] + local_738;
                        }
                        local_70c = (uint)*(ushort *)((long)local_760 + 6);
                        if ((*(ushort *)((long)local_760 + 6) & 8) != 0) {
                          if ((*(int *)(*(long *)(local_700 + 0x68) + 100) == 0) && (local_c34 == 0)
                             ) {
                            lVar5 = (**(code **)(local_700 + 0x48))
                                              (*(undefined8 *)(local_700 + 0x60),local_730,piVar8,
                                               0x10);
                            if (lVar5 != 0x10) {
                              (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,piVar8);
                              if (local_6f8 != (mz_zip_archive *)0x0) {
                                local_6f8->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                              }
                              return 0;
                            }
                            in_stack_fffffffffffff37c = (uint)(*piVar8 == 0x8074b50);
                            if (local_6f8->m_pState->m_zip64 == 0) {
                              iVar4 = 3;
                              if (in_stack_fffffffffffff37c != 0) {
                                iVar4 = 4;
                              }
                              local_708[0] = iVar4 << 2;
                            }
                            else {
                              lVar5 = 0;
                              if (in_stack_fffffffffffff37c != 0) {
                                lVar5 = 4;
                              }
                              in_stack_fffffffffffff370 = (uint32_t *)((long)piVar8 + lVar5);
                              in_stack_fffffffffffff36c = *in_stack_fffffffffffff370;
                              local_24c = in_stack_fffffffffffff370[1];
                              in_stack_fffffffffffff360 = (mz_zip_archive *)(ulong)local_24c;
                              local_27c = in_stack_fffffffffffff370[2];
                              in_stack_fffffffffffff358 = (mz_uint64 *)(ulong)local_27c;
                              local_2ac = 0x8074b50;
                              *(undefined1 *)piVar8 = 0x50;
                              *(undefined1 *)((long)piVar8 + 1) = 0x4b;
                              *(undefined1 *)((long)piVar8 + 2) = 7;
                              *(undefined1 *)((long)piVar8 + 3) = 8;
                              local_2b8 = piVar8 + 1;
                              *(char *)local_2b8 = (char)in_stack_fffffffffffff36c;
                              *(char *)((long)piVar8 + 5) = (char)(in_stack_fffffffffffff36c >> 8);
                              *(char *)((long)piVar8 + 6) =
                                   (char)(in_stack_fffffffffffff36c >> 0x10);
                              *(char *)((long)piVar8 + 7) =
                                   (char)(in_stack_fffffffffffff36c >> 0x18);
                              local_268 = piVar8 + 2;
                              *(char *)local_268 = (char)local_24c;
                              *(char *)((long)piVar8 + 9) = (char)(local_24c >> 8);
                              *(char *)((long)piVar8 + 10) = (char)(local_24c >> 0x10);
                              *(char *)((long)piVar8 + 0xb) = (char)(local_24c >> 0x18);
                              local_258 = piVar8 + 3;
                              local_25c = 0;
                              *(undefined1 *)local_258 = 0;
                              *(undefined1 *)((long)piVar8 + 0xd) = 0;
                              *(undefined1 *)((long)piVar8 + 0xe) = 0;
                              *(undefined1 *)((long)piVar8 + 0xf) = 0;
                              local_298 = piVar8 + 4;
                              *(char *)local_298 = (char)local_27c;
                              *(char *)((long)piVar8 + 0x11) = (char)(local_27c >> 8);
                              *(char *)((long)piVar8 + 0x12) = (char)(local_27c >> 0x10);
                              *(char *)((long)piVar8 + 0x13) = (char)(local_27c >> 0x18);
                              local_288 = piVar8 + 5;
                              local_28c = 0;
                              *(undefined1 *)local_288 = 0;
                              *(undefined1 *)((long)piVar8 + 0x15) = 0;
                              *(undefined1 *)((long)piVar8 + 0x16) = 0;
                              *(undefined1 *)((long)piVar8 + 0x17) = 0;
                              local_708[0] = 0x18;
                              local_2bc = in_stack_fffffffffffff36c;
                              local_2a8 = piVar8;
                              local_2a0 = in_stack_fffffffffffff358;
                              local_278 = local_298;
                              local_270 = in_stack_fffffffffffff360;
                              local_248 = local_268;
                            }
                          }
                          else {
                            lVar5 = (**(code **)(local_700 + 0x48))
                                              (*(undefined8 *)(local_700 + 0x60),local_730,piVar8,
                                               0x18);
                            if (lVar5 != 0x18) {
                              (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,piVar8);
                              if (local_6f8 != (mz_zip_archive *)0x0) {
                                local_6f8->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                              }
                              return 0;
                            }
                            iVar4 = 5;
                            if (*piVar8 == 0x8074b50) {
                              iVar4 = 6;
                            }
                            local_708[0] = iVar4 << 2;
                          }
                          sVar7 = (*local_6f8->m_pWrite)
                                            (local_6f8->m_pIO_opaque,local_738,piVar8,
                                             (ulong)local_708[0]);
                          if (sVar7 != local_708[0]) {
                            (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,piVar8);
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                            }
                            return 0;
                          }
                          local_730 = (ulong)local_708[0] + local_730;
                          local_738 = local_708[0] + local_738;
                        }
                        (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,piVar8);
                        uVar6 = (pmVar1->m_central_dir).m_size;
                        memcpy(local_798,__src,0x2e);
                        if (pmVar1->m_zip64 == 0) {
                          if (0xffffffff < local_738) {
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
                            }
                            return 0;
                          }
                          if (0xfffffffe < local_728) {
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
                            }
                            return 0;
                          }
                          local_2f8 = &local_76e;
                          local_2fc = (undefined4)local_728;
                          local_76e = (undefined1)local_728;
                          local_76d = (undefined1)(local_728 >> 8);
                          local_76c = (undefined1)(local_728 >> 0x10);
                          local_76b = (undefined1)(local_728 >> 0x18);
                          local_180 = local_798;
                          local_170 = local_6f8;
                          local_188 = 0x2e;
                          local_190 = (pmVar1->m_central_dir).m_size;
                          local_160 = local_190 + 0x2e;
                          local_150 = local_6f8;
                          local_164 = 1;
                          local_178 = pmVar1;
                          local_158 = pmVar1;
                          if (((pmVar1->m_central_dir).m_capacity < local_160) &&
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pZip_00,(mz_zip_array *)pArray,
                                                 (size_t)in_stack_fffffffffffff308,growing),
                             mVar2 == 0)) {
                            local_144 = 0;
                          }
                          else {
                            (local_158->m_central_dir).m_size = local_160;
                            local_144 = 1;
                          }
                          bVar9 = local_144 != 0;
                          if (bVar9) {
                            memcpy((void *)((long)(local_178->m_central_dir).m_p +
                                           local_190 * (local_178->m_central_dir).m_element_size),
                                   local_180,
                                   local_188 * (ulong)(local_178->m_central_dir).m_element_size);
                          }
                          local_168 = (uint)bVar9;
                          if (local_168 == 0) {
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_1d0 = (void *)((long)__src + 0x2e);
                          local_1d8 = (ulong)local_714;
                          local_1c0 = local_6f8;
                          local_1e0 = (pmVar1->m_central_dir).m_size;
                          local_1b0 = local_1e0 + local_1d8;
                          local_1a0 = local_6f8;
                          local_1b4 = 1;
                          local_1c8 = pmVar1;
                          local_1a8 = pmVar1;
                          if (((pmVar1->m_central_dir).m_capacity < local_1b0) &&
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pZip_00,(mz_zip_array *)pArray,
                                                 (size_t)in_stack_fffffffffffff308,growing),
                             mVar2 == 0)) {
                            local_194 = 0;
                          }
                          else {
                            (local_1a8->m_central_dir).m_size = local_1b0;
                            local_194 = 1;
                          }
                          bVar9 = local_194 != 0;
                          if (bVar9) {
                            memcpy((void *)((long)(local_1c8->m_central_dir).m_p +
                                           local_1e0 * (local_1c8->m_central_dir).m_element_size),
                                   local_1d0,local_1d8 * (local_1c8->m_central_dir).m_element_size);
                          }
                          local_1b8 = (uint)bVar9;
                          if (local_1b8 == 0) {
                            local_440 = local_6f8;
                            local_454 = 0;
                            local_450 = uVar6;
                            local_448 = pmVar1;
                            if ((uVar6 <= (pmVar1->m_central_dir).m_capacity) ||
                               (mVar2 = mz_zip_array_ensure_capacity
                                                  (pZip_00,(mz_zip_array *)pArray,
                                                   (size_t)in_stack_fffffffffffff308,growing),
                               mVar2 != 0)) {
                              (local_448->m_central_dir).m_size = local_450;
                            }
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                        }
                        else {
                          local_4b0 = &local_cd0;
                          local_4b4 = 1;
                          memset(local_4b0,0,0x20);
                          *(undefined4 *)(local_4b0 + 3) = local_4b4;
                          local_2c8 = &local_784;
                          local_2cc = 0xffffffff;
                          local_784 = 0xff;
                          local_783 = 0xff;
                          local_782 = 0xff;
                          local_781 = 0xff;
                          local_2d8 = &local_780;
                          local_2dc = 0xffffffff;
                          local_780 = 0xff;
                          local_77f = 0xff;
                          local_77e = 0xff;
                          local_77d = 0xff;
                          local_2e8 = &local_76e;
                          local_2ec = 0xffffffff;
                          local_76e = 0xff;
                          local_76d = 0xff;
                          local_76c = 0xff;
                          local_76b = 0xff;
                          mVar2 = mz_zip_writer_update_zip64_extension_block
                                            (in_stack_fffffffffffff380,
                                             (mz_zip_archive *)
                                             CONCAT44(in_stack_fffffffffffff37c,
                                                      in_stack_fffffffffffff378),
                                             (mz_uint8 *)in_stack_fffffffffffff370,
                                             in_stack_fffffffffffff36c,
                                             &in_stack_fffffffffffff360->m_archive_size,
                                             in_stack_fffffffffffff358,in_stack_fffffffffffff590,
                                             in_stack_fffffffffffff598);
                          if (mVar2 == 0) {
                            local_358 = local_6f8;
                            local_360 = &local_cd0;
                            (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_cd0);
                            memset(local_360,0,0x20);
                            return 0;
                          }
                          local_238 = &local_77a;
                          local_23a = (undefined2)local_cc8;
                          local_77a = (undefined1)local_cc8;
                          local_779 = (undefined1)((ulong)local_cc8 >> 8);
                          local_40 = local_798;
                          local_30 = local_6f8;
                          local_48 = 0x2e;
                          local_50 = (pmVar1->m_central_dir).m_size;
                          local_20 = local_50 + 0x2e;
                          local_10 = local_6f8;
                          local_24 = 1;
                          local_38 = pmVar1;
                          local_18 = pmVar1;
                          if (((pmVar1->m_central_dir).m_capacity < local_20) &&
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pZip_00,(mz_zip_array *)pArray,
                                                 (size_t)in_stack_fffffffffffff308,growing),
                             mVar2 == 0)) {
                            local_4 = 0;
                          }
                          else {
                            (local_18->m_central_dir).m_size = local_20;
                            local_4 = 1;
                          }
                          bVar9 = local_4 != 0;
                          if (bVar9) {
                            memcpy((void *)((long)(local_38->m_central_dir).m_p +
                                           local_50 * (local_38->m_central_dir).m_element_size),
                                   local_40,local_48 *
                                            (ulong)(local_38->m_central_dir).m_element_size);
                          }
                          local_28 = (uint)bVar9;
                          if (local_28 == 0) {
                            local_368 = local_6f8;
                            local_370 = &local_cd0;
                            (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_cd0);
                            memset(local_370,0,0x20);
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_90 = (void *)((long)__src + 0x2e);
                          local_98 = (ulong)local_c0c;
                          local_80 = local_6f8;
                          local_a0 = (pmVar1->m_central_dir).m_size;
                          local_70 = local_a0 + local_98;
                          local_60 = local_6f8;
                          local_74 = 1;
                          local_88 = pmVar1;
                          local_68 = pmVar1;
                          if (((pmVar1->m_central_dir).m_capacity < local_70) &&
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pZip_00,(mz_zip_array *)pArray,
                                                 (size_t)in_stack_fffffffffffff308,growing),
                             mVar2 == 0)) {
                            local_54 = 0;
                          }
                          else {
                            (local_68->m_central_dir).m_size = local_70;
                            local_54 = 1;
                          }
                          bVar9 = local_54 != 0;
                          if (bVar9) {
                            memcpy((void *)((long)(local_88->m_central_dir).m_p +
                                           local_a0 * (local_88->m_central_dir).m_element_size),
                                   local_90,local_98 * (local_88->m_central_dir).m_element_size);
                          }
                          local_78 = (uint)bVar9;
                          if (local_78 == 0) {
                            local_378 = local_6f8;
                            local_380 = &local_cd0;
                            (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_cd0);
                            memset(local_380,0,0x20);
                            local_3e0 = local_6f8;
                            local_3f4 = 0;
                            local_3f0 = uVar6;
                            local_3e8 = pmVar1;
                            if ((uVar6 <= (pmVar1->m_central_dir).m_capacity) ||
                               (mVar2 = mz_zip_array_ensure_capacity
                                                  (pZip_00,(mz_zip_array *)pArray,
                                                   (size_t)in_stack_fffffffffffff308,growing),
                               mVar2 != 0)) {
                              (local_3e8->m_central_dir).m_size = local_3f0;
                            }
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_d0 = local_6f8;
                          local_e0 = local_cd0;
                          local_e8 = local_cc8;
                          local_f0 = (pmVar1->m_central_dir).m_size;
                          local_c0 = local_f0 + local_cc8;
                          local_b0 = local_6f8;
                          local_c4 = 1;
                          local_d8 = pmVar1;
                          local_b8 = pmVar1;
                          if (((pmVar1->m_central_dir).m_capacity < local_c0) &&
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pZip_00,(mz_zip_array *)pArray,
                                                 (size_t)in_stack_fffffffffffff308,growing),
                             mVar2 == 0)) {
                            local_a4 = 0;
                          }
                          else {
                            (local_b8->m_central_dir).m_size = local_c0;
                            local_a4 = 1;
                          }
                          bVar9 = local_a4 != 0;
                          if (bVar9) {
                            memcpy((void *)((long)(local_d8->m_central_dir).m_p +
                                           local_f0 * (local_d8->m_central_dir).m_element_size),
                                   local_e0,local_e8 *
                                            (ulong)(local_d8->m_central_dir).m_element_size);
                          }
                          local_c8 = (uint)bVar9;
                          if (local_c8 == 0) {
                            local_388 = local_6f8;
                            local_390 = &local_cd0;
                            (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_cd0);
                            memset(local_390,0,0x20);
                            local_400 = local_6f8;
                            local_414 = 0;
                            local_410 = uVar6;
                            local_408 = pmVar1;
                            if ((uVar6 <= (pmVar1->m_central_dir).m_capacity) ||
                               (mVar2 = mz_zip_array_ensure_capacity
                                                  (pZip_00,(mz_zip_array *)pArray,
                                                   (size_t)in_stack_fffffffffffff308,growing),
                               mVar2 != 0)) {
                              (local_408->m_central_dir).m_size = local_410;
                            }
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_130 = (void *)((long)__src +
                                              (ulong)local_c14 + (ulong)local_c0c + 0x2e);
                          local_138 = (ulong)local_c10;
                          local_120 = local_6f8;
                          local_140 = (pmVar1->m_central_dir).m_size;
                          local_110 = local_140 + local_138;
                          local_100 = local_6f8;
                          local_114 = 1;
                          local_128 = pmVar1;
                          local_108 = pmVar1;
                          if (((pmVar1->m_central_dir).m_capacity < local_110) &&
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pZip_00,(mz_zip_array *)pArray,
                                                 (size_t)in_stack_fffffffffffff308,growing),
                             mVar2 == 0)) {
                            local_f4 = 0;
                          }
                          else {
                            (local_108->m_central_dir).m_size = local_110;
                            local_f4 = 1;
                          }
                          bVar9 = local_f4 != 0;
                          if (bVar9) {
                            memcpy((void *)((long)(local_128->m_central_dir).m_p +
                                           local_140 * (local_128->m_central_dir).m_element_size),
                                   local_130,local_138 * (local_128->m_central_dir).m_element_size);
                          }
                          local_118 = (uint)bVar9;
                          if (local_118 == 0) {
                            local_398 = local_6f8;
                            local_3a0 = &local_cd0;
                            (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_cd0);
                            memset(local_3a0,0,0x20);
                            local_420 = local_6f8;
                            local_434 = 0;
                            local_430 = uVar6;
                            local_428 = pmVar1;
                            if ((uVar6 <= (pmVar1->m_central_dir).m_capacity) ||
                               (mVar2 = mz_zip_array_ensure_capacity
                                                  (pZip_00,(mz_zip_array *)pArray,
                                                   (size_t)in_stack_fffffffffffff308,growing),
                               mVar2 != 0)) {
                              (local_428->m_central_dir).m_size = local_430;
                            }
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_3a8 = local_6f8;
                          local_3b0 = &local_cd0;
                          (*local_6f8->m_pFree)(local_6f8->m_pAlloc_opaque,local_cd0);
                          memset(local_3b0,0,0x20);
                        }
                        if ((pmVar1->m_central_dir).m_size < 0xffffffff) {
                          local_708[0] = (uint)uVar6;
                          local_218 = &pmVar1->m_central_dir_offsets;
                          local_210 = local_6f8;
                          local_220 = local_708;
                          local_228 = 1;
                          local_230 = (pmVar1->m_central_dir_offsets).m_size;
                          local_200 = local_230 + 1;
                          local_1f0 = local_6f8;
                          local_204 = 1;
                          local_1f8 = local_218;
                          if (((pmVar1->m_central_dir_offsets).m_capacity < local_200) &&
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pZip_00,(mz_zip_array *)pArray,
                                                 (size_t)in_stack_fffffffffffff308,growing),
                             mVar2 == 0)) {
                            local_1e4 = 0;
                          }
                          else {
                            local_1f8->m_size = local_200;
                            local_1e4 = 1;
                          }
                          bVar9 = local_1e4 != 0;
                          if (bVar9) {
                            memcpy((void *)((long)local_218->m_p +
                                           local_230 * local_218->m_element_size),local_220,
                                   local_228 * (ulong)local_218->m_element_size);
                          }
                          local_208 = (uint)bVar9;
                          if (local_208 == 0) {
                            local_480 = local_6f8;
                            local_494 = 0;
                            local_490 = uVar6;
                            local_488 = pmVar1;
                            if ((uVar6 <= (pmVar1->m_central_dir).m_capacity) ||
                               (mVar2 = mz_zip_array_ensure_capacity
                                                  (pZip_00,(mz_zip_array *)pArray,
                                                   (size_t)in_stack_fffffffffffff308,growing),
                               mVar2 != 0)) {
                              (local_488->m_central_dir).m_size = local_490;
                            }
                            if (local_6f8 != (mz_zip_archive *)0x0) {
                              local_6f8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            local_6f0 = 0;
                          }
                          else {
                            local_6f8->m_total_files = local_6f8->m_total_files + 1;
                            local_6f8->m_archive_size = local_738;
                            local_6f0 = 1;
                          }
                        }
                        else {
                          local_460 = local_6f8;
                          local_474 = 0;
                          local_470 = uVar6;
                          local_468 = pmVar1;
                          if ((uVar6 <= (pmVar1->m_central_dir).m_capacity) ||
                             (mVar2 = mz_zip_array_ensure_capacity
                                                (pZip_00,(mz_zip_array *)pArray,
                                                 (size_t)in_stack_fffffffffffff308,growing),
                             mVar2 != 0)) {
                            (local_468->m_central_dir).m_size = local_470;
                          }
                          if (local_6f8 != (mz_zip_archive *)0x0) {
                            local_6f8->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
                          }
                          local_6f0 = 0;
                        }
                      }
                    }
                    else {
                      if (local_6f8 != (mz_zip_archive *)0x0) {
                        local_6f8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                      }
                      local_6f0 = 0;
                    }
                  }
                }
              }
              else {
                if (local_6f8 != (mz_zip_archive *)0x0) {
                  local_6f8->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                }
                local_6f0 = 0;
              }
            }
            else {
              if (local_6f8 != (mz_zip_archive *)0x0) {
                local_6f8->m_last_error = MZ_ZIP_FILE_READ_FAILED;
              }
              local_6f0 = 0;
            }
          }
        }
        else {
          if (in_RDI != (mz_zip_archive *)0x0) {
            in_RDI->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
          }
          local_6f0 = 0;
        }
      }
      else {
        if (in_RDI != (mz_zip_archive *)0x0) {
          in_RDI->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        }
        local_6f0 = 0;
      }
    }
    else {
      if (in_RDI != (mz_zip_archive *)0x0) {
        in_RDI->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      }
      local_6f0 = 0;
    }
  }
  return local_6f0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32 *pSrc_descriptor = (const mz_uint32 *)((const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}